

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator_mq.c
# Opt level: O3

void validator_mq_send(mqd_t validator_mq,_Bool start,_Bool halt,_Bool completed,_Bool finish,
                      _Bool accepted,pid_t tester_pid,char *word,_Bool *err)

{
  size_t __n;
  undefined3 in_register_00000089;
  validator_mq_msg local_430;
  mqd_t local_38;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000089,accepted);
  local_38 = validator_mq;
  memset(&local_430.accepted,0,0x3f4);
  local_430.accepted = SUB41(local_34,0);
  local_430.tester_pid = tester_pid;
  local_430.start = start;
  local_430.halt = halt;
  local_430.completed = completed;
  local_430.finish = finish;
  memset(local_430.word,0,0x3e9);
  if (word != (char *)0x0) {
    __n = strlen(word);
    memcpy(local_430.word,word,__n);
  }
  validator_mq_send_msg(local_38,&local_430,err);
  if (*err == true) {
    *err = true;
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/validator_mq.c"
                  ,"validator_mq_send");
  }
  return;
}

Assistant:

void validator_mq_send(mqd_t validator_mq, bool start, bool halt, bool completed, bool finish, bool accepted,
                       pid_t tester_pid, const char *word, bool *err) {
    assert(err != NULL);

    validator_mq_msg msg;
    memset(&msg, 0, sizeof(validator_mq_msg)); // to prevent valgrind errors
    msg = (validator_mq_msg){start, halt, completed, finish, accepted, tester_pid, ""};
    if(word != NULL) {
        memcpy(msg.word, word, strlen(word));
    }

    validator_mq_send_msg(validator_mq, &msg, err);
    VOID_FAIL_IF(*err);
}